

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

BOOL __thiscall
Memory::Recycler::GetPartialFlag<(Memory::CollectionFlags)2449477633>(Recycler *this)

{
  Recycler *this_local;
  
  return 0;
}

Assistant:

BOOL
Recycler::GetPartialFlag()
{
#if ENABLE_PARTIAL_GC
#pragma prefast(suppress:6313, "flags is a template parameter and can be 0")
    return(flags & CollectMode_Partial) && inPartialCollectMode;
#else
    return false;
#endif
}